

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O0

void __thiscall
Buffer_change_event_remove_string_Test::TestBody(Buffer_change_event_remove_string_Test *this)

{
  initializer_list<bfy_changed_cb_info> __l;
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  char *message;
  bfy_buffer *buf;
  AssertHelper local_180;
  Message local_178;
  allocator<bfy_changed_cb_info> local_169;
  bfy_changed_cb_info local_168;
  iterator local_150;
  size_type local_148;
  vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> local_140;
  undefined1 local_128 [8];
  AssertionResult gtest_ar;
  bfy_changed_cb_info expected;
  BufferWithReadonlyStrings local;
  Buffer_change_event_remove_string_Test *this_local;
  
  local.changes.super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::BufferWithReadonlyStrings
            ((BufferWithReadonlyStrings *)&expected.n_deleted);
  sVar2 = bfy_buffer_get_content_len((bfy_buffer *)&expected.n_deleted);
  expected.orig_size = 1;
  sVar3 = bfy_buffer_get_content_len((bfy_buffer *)&expected.n_deleted);
  expected.n_added = sVar3 + 1;
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::start_listening_to_changes
            ((BufferWithReadonlyStrings *)&expected.n_deleted);
  (anonymous_namespace)::buffer_remove_string_abi_cxx11_
            ((string *)&gtest_ar.message_,(_anonymous_namespace_ *)&expected.n_deleted,buf);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  local_168.n_deleted = expected.n_added;
  local_168.n_added = expected.orig_size;
  local_150 = &local_168;
  local_148 = 1;
  local_168.orig_size = sVar2;
  std::allocator<bfy_changed_cb_info>::allocator(&local_169);
  __l._M_len = local_148;
  __l._M_array = local_150;
  std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>::vector
            (&local_140,__l,&local_169);
  testing::internal::EqHelper::
  Compare<std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>,_std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>,_nullptr>
            ((EqHelper *)local_128,"changes_t{expected}","local.changes",&local_140,
             (vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> *)
             ((long)&local.allstrs.field_2 + 8));
  std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>::~vector(&local_140);
  std::allocator<bfy_changed_cb_info>::~allocator(&local_169);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x63e,message);
    testing::internal::AssertHelper::operator=(&local_180,&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::~BufferWithReadonlyStrings
            ((BufferWithReadonlyStrings *)&expected.n_deleted);
  return;
}

Assistant:

TEST(Buffer, change_event_remove_string) {
    BufferWithReadonlyStrings local;
    auto const expected = bfy_changed_cb_info {
        .orig_size = bfy_buffer_get_content_len(&local.buf),
        .n_added = 1,
        .n_deleted = 1 + bfy_buffer_get_content_len(&local.buf)
    };

    local.start_listening_to_changes();
    buffer_remove_string(&local.buf);
    EXPECT_EQ(changes_t{expected}, local.changes);
}